

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# morph_vertex_list.c
# Opt level: O1

bool_t prf_morph_vertex_list_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint8_t *puVar2;
  uint uVar3;
  bool_t bVar4;
  ulong uVar5;
  int iVar6;
  
  if (node->opcode == prf_morph_vertex_list_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar1 = node->length;
    bVar4 = 1;
    if (7 < uVar1) {
      puVar2 = node->data;
      iVar6 = uVar1 - 1;
      if (-1 < (int)(uVar1 - 4)) {
        iVar6 = uVar1 - 4;
      }
      uVar3 = iVar6 >> 2;
      if (iVar6 >> 2 < 2) {
        uVar3 = 1;
      }
      uVar5 = 0;
      do {
        bf_put_uint32_be(bfile,*(uint32_t *)(puVar2 + uVar5 * 4));
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else {
    bVar4 = 0;
    prf_error(9,"tried morph vertex list save method on node of type %d.");
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_morph_vertex_list_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint32_t * ptr;
    int num, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_morph_vertex_list_info.opcode ) {
        prf_error( 9, "tried morph vertex list save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        bf_put_uint32_be( bfile, ptr[num] );
        num++;
    }

    return TRUE;
}